

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_8::DiskHandle::write(DiskHandle *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  ssize_t in_RAX;
  undefined4 in_register_00000034;
  long __offset;
  Fault f;
  Fault f_1;
  Fault local_40;
  Fault local_38;
  undefined8 uStack_30;
  
  __offset = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
    do {
      while( true ) {
        in_RAX = pwrite((this->fd).fd,__buf,__n,__offset);
        if (-1 < in_RAX) break;
        iVar1 = _::Debug::getOsErrorNumber(false);
        if (iVar1 != -1) {
          if (iVar1 != 0) {
            local_40.exception = (Exception *)0x0;
            local_38.exception = (Exception *)0x0;
            uStack_30 = 0;
            _::Debug::Fault::init
                      (&local_40,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                      );
            _::Debug::Fault::fatal(&local_40);
          }
LAB_00217282:
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x179,FAILED,"n > 0","\"pwrite() returned zero?\"",
                     (char (*) [24])"pwrite() returned zero?");
          _::Debug::Fault::fatal(&local_38);
        }
      }
      if (in_RAX == 0) goto LAB_00217282;
      __offset = __offset + in_RAX;
      __buf = (void *)((long)__buf + in_RAX);
      __n = __n - in_RAX;
    } while (__n != 0);
  }
  return in_RAX;
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const {
    // pwrite() probably never returns short writes unless there's no space left on disk.
    // Unfortunately, though, per spec we are not allowed to assume this.

    while (data.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pwrite(fd, data.begin(), data.size(), offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");
      offset += n;
      data = data.slice(n, data.size());
    }
  }